

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_build_lut(uint64_t max_cw_len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong *puVar4;
  
  lVar3 = max_cw_len - 1;
  lVar2 = 0;
  do {
    if (-1 < lVar3) {
      puVar4 = shuff_lj_base + lVar3;
      do {
        if ((lVar2 << 0x38) + 0xffffffffffffffU <= *puVar4) goto LAB_00121460;
        puVar4 = puVar4 + -1;
        bVar1 = 0 < lVar3;
        lVar3 = lVar3 + -1;
      } while (bVar1);
      lVar3 = -1;
    }
LAB_00121460:
    puVar4 = (ulong *)0x0;
    if (shuff_lj_base[lVar3 + 1] <= (ulong)(lVar2 << 0x38)) {
      puVar4 = shuff_lj_base + lVar3 + 1;
    }
    shuff_lut[lVar2] = puVar4;
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void shuff_build_lut(uint64_t max_cw_len)
{
    uint64_t max, min; // range of left justified "i"
    int64_t i, j = max_cw_len - 1; // pointer into lj

    for (i = 0; i < SHUFF_LUT_SIZE; i++) {
        min = i << ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS);
        max = min | SHUFF_MAX_IT;

        while ((j >= 0) && (max > shuff_lj_base[j]))
            j--;

        // we know max is in range of lj[j], so check min
        if (min >= shuff_lj_base[j + 1])
            shuff_lut[i] = shuff_lj_base + j + 1;
        else
            shuff_lut[i] = NULL; //-(j+1);
    }
}